

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O3

void __thiscall PatternSelection::moveTo(PatternSelection *this,PatternAnchor cursor)

{
  int iVar1;
  Iterator iter;
  Iterator local_38;
  
  iterator(&local_38,this);
  (this->mStart).super_PatternCursorBase.row = local_38.mStart.super_PatternCursorBase.row;
  (this->mStart).super_PatternCursorBase.column = local_38.mStart.super_PatternCursorBase.column;
  (this->mEnd).super_PatternCursorBase.row = local_38.mEnd.super_PatternCursorBase.row;
  (this->mEnd).super_PatternCursorBase.column = local_38.mEnd.super_PatternCursorBase.column;
  (this->mStart).super_PatternCursorBase.row = cursor.super_PatternCursorBase.row;
  (this->mEnd).super_PatternCursorBase.row =
       (local_38.mEnd.super_PatternCursorBase.row + cursor.super_PatternCursorBase.row) -
       local_38.mStart.super_PatternCursorBase.row;
  if ((local_38.mStart.super_PatternCursorBase.track == local_38.mEnd.super_PatternCursorBase.track)
     && (1 < local_38.mStart.super_PatternCursorBase.column)) {
    iVar1 = 2;
    if (2 < cursor.super_PatternCursorBase.column) {
      iVar1 = cursor.super_PatternCursorBase.column;
    }
    (this->mStart).super_PatternCursorBase.column = iVar1;
    (this->mEnd).super_PatternCursorBase.column =
         (iVar1 - local_38.mStart.super_PatternCursorBase.column) +
         local_38.mEnd.super_PatternCursorBase.column;
  }
  (this->mStart).super_PatternCursorBase.track = cursor.super_PatternCursorBase.track;
  (this->mEnd).super_PatternCursorBase.track =
       (cursor.super_PatternCursorBase.track - local_38.mStart.super_PatternCursorBase.track) +
       local_38.mEnd.super_PatternCursorBase.track;
  return;
}

Assistant:

void PatternSelection::moveTo(PatternAnchor cursor) {
    auto iter = iterator();
    // normalize the selection coordinates
    mStart = iter.mStart;
    mEnd = iter.mEnd;

    // move to row
    mStart.row = cursor.row;
    mEnd.row = cursor.row + iter.rows() - 1;

    // if the selection is just effects, we can move it to another effect column
    // otherwise we can only move by tracks
    if (iter.trackStart() == iter.trackEnd()) {
        // within the same track
        if (isEffect(iter.columnStart())) {
            // only effects are selected, move by column
            auto start = std::max((int)PatternAnchor::SelectEffect1, cursor.column);
            int end = start + iter.columnEnd() - iter.columnStart();
            mStart.column = start;
            mEnd.column = end;
        }
    }

    // move to track
    mStart.track = cursor.track;
    mEnd.track = cursor.track + iter.trackEnd() - iter.trackStart();
}